

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_complete_bytecode(sexp ctx)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  sexp psVar4;
  sexp psVar5;
  
  sexp_emit_return(ctx);
  sexp_shrink_bcode(ctx,(long)(((ctx->value).opcode.methods)->value).type.setters >> 1);
  psVar1 = (((ctx->value).opcode.methods)->value).type.cpl;
  psVar4 = (psVar1->value).type.cpl;
  if ((((ulong)psVar4 & 3) != 0) || (psVar4->tag != 6)) goto LAB_001265b3;
  psVar5 = (psVar4->value).type.cpl;
  if (psVar5 == (sexp)0x23e) {
    psVar4 = (psVar4->value).type.name;
LAB_00126594:
    (psVar1->value).type.cpl = psVar4;
  }
  else {
    if ((psVar5->value).type.cpl != (sexp)0x23e) {
      psVar4 = sexp_list_to_vector_op(ctx,(sexp)0x0,1,psVar4);
      goto LAB_00126594;
    }
    (psVar4->value).type.cpl = (sexp)(psVar5->value).flonum;
    psVar4 = (psVar1->value).type.cpl;
  }
  if ((((ulong)psVar4 & 3) == 0) && (psVar4->tag == 0x13)) {
    return psVar4;
  }
LAB_001265b3:
  (psVar1->value).type.setters =
       (sexp)((long)(((ctx->value).opcode.methods)->value).type.print >> 1);
  psVar4 = (psVar1->value).type.slots;
  if ((((ulong)psVar4 & 3) == 0 && psVar4 != (sexp)0x0) && (psVar4->tag == 6)) {
    psVar5 = sexp_nreverse_op(ctx,(sexp)0x0,1,psVar4);
    (psVar1->value).type.slots = psVar5;
    psVar4 = (psVar5->value).type.cpl;
    if ((((((ulong)psVar4 & 3) == 0) &&
         ((((psVar4->tag == 6 && (psVar2 = (psVar5->value).type.name, ((ulong)psVar2 & 3) == 0)) &&
           (psVar2->tag == 6)) &&
          ((psVar2 = (psVar2->value).type.cpl, ((ulong)psVar2 & 3) == 0 && (psVar2->tag == 6))))))
        && (psVar3 = (psVar4->value).type.name, ((ulong)psVar3 & 3) == 0)) &&
       (((psVar3->tag == 6 && (psVar3 = (psVar3->value).type.cpl, ((ulong)psVar3 & 3) == 0)) &&
        ((psVar3->tag == 6 && ((psVar2->value).type.name == (psVar3->value).type.name)))))) {
      (psVar1->value).type.slots = psVar4;
      psVar5 = psVar4;
    }
    psVar4 = sexp_list_to_vector_op(ctx,(sexp)0x0,1,psVar5);
    (psVar1->value).type.slots = psVar4;
  }
  psVar4 = (((ctx->value).opcode.methods)->value).type.dl;
  if ((((ulong)psVar4 & 3) != 0) || (psVar4->tag != 0x13)) {
    psVar4 = psVar1;
  }
  return psVar4;
}

Assistant:

sexp sexp_complete_bytecode (sexp ctx) {
  sexp bc;
  sexp_emit_return(ctx);
  sexp_shrink_bcode(ctx, sexp_unbox_fixnum(sexp_context_pos(ctx)));
  bc = sexp_context_bc(ctx);
  if (sexp_pairp(sexp_bytecode_literals(bc))) { /* compress literals */
    if (sexp_nullp(sexp_cdr(sexp_bytecode_literals(bc))))
      sexp_bytecode_literals(bc) = sexp_car(sexp_bytecode_literals(bc));
    else if (sexp_nullp(sexp_cddr(sexp_bytecode_literals(bc))))
      sexp_cdr(sexp_bytecode_literals(bc)) = sexp_cadr(sexp_bytecode_literals(bc));
    else
      sexp_bytecode_literals(bc) = sexp_list_to_vector(ctx, sexp_bytecode_literals(bc));
    if (sexp_exceptionp(sexp_bytecode_literals(bc)))
      return sexp_bytecode_literals(bc);
  }
  sexp_bytecode_max_depth(bc) = sexp_unbox_fixnum(sexp_context_max_depth(ctx));
#if SEXP_USE_FULL_SOURCE_INFO
  if (sexp_bytecode_source(bc) && sexp_pairp(sexp_bytecode_source(bc))) {
    sexp_bytecode_source(bc) = sexp_nreverse(ctx, sexp_bytecode_source(bc));
    /* omit the leading -1 source marker for the bytecode if the next */
    /* entry is in the same file */
    if (sexp_pairp(sexp_cdr(sexp_bytecode_source(bc))) &&
        sexp_pairp(sexp_car(sexp_bytecode_source(bc))) &&
        sexp_pairp(sexp_cdar(sexp_bytecode_source(bc))) &&
        sexp_pairp(sexp_cadr(sexp_bytecode_source(bc))) &&
        sexp_pairp(sexp_cdr(sexp_cadr(sexp_bytecode_source(bc)))) &&
        sexp_cadr(sexp_car(sexp_bytecode_source(bc)))
        == sexp_cadr(sexp_cadr(sexp_bytecode_source(bc)))) {
      sexp_bytecode_source(bc) = sexp_cdr(sexp_bytecode_source(bc));
    }
    sexp_bytecode_source(bc) = sexp_list_to_vector(ctx, sexp_bytecode_source(bc));
  }
#endif
  sexp_bless_bytecode(ctx, bc);
  if (sexp_exceptionp(sexp_context_exception(ctx)))
    return sexp_context_exception(ctx);
  return bc;
}